

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen10TextureCalc::GetAligned3DBlockHeight
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t BlockHeight,
          uint32_t ExpandedArraySize)

{
  GMM_PLATFORM_INFO *pGVar1;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t DAlign;
  uint32_t ExpandedArraySize_local;
  uint32_t BlockHeight_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen10TextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    CompressHeight = ExpandedArraySize;
    DAlign = BlockHeight;
    _ExpandedArraySize_local = pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar1 = GmmGetPlatformInfo((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext
                               );
    CompressWidth = (_ExpandedArraySize_local->Alignment).DAlign;
    GmmTextureCalc::GetCompressionBlockDimensions
              ((GmmTextureCalc *)this,_ExpandedArraySize_local->Format,
               (uint32_t *)((long)&pPlatform + 4),&CompressDepth,(uint32_t *)&pPlatform);
    if ((_ExpandedArraySize_local->Type == RESOURCE_3D) &&
       (((ulong)(_ExpandedArraySize_local->Flags).Info >> 0x13 & 1) == 0)) {
      DAlign = (DAlign + (pGVar1->TileInfo[_ExpandedArraySize_local->TileMode].LogicalTileHeight - 1
                         )) -
               (DAlign + (pGVar1->TileInfo[_ExpandedArraySize_local->TileMode].LogicalTileHeight - 1
                         ) &
               pGVar1->TileInfo[_ExpandedArraySize_local->TileMode].LogicalTileHeight - 1);
    }
    this_local._4_4_ = DAlign;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GmmLib::GmmGen10TextureCalc::GetAligned3DBlockHeight(GMM_TEXTURE_INFO *pTexInfo,
                                                              uint32_t          BlockHeight,
                                                              uint32_t          ExpandedArraySize)
{
    uint32_t DAlign, CompressHeight, CompressWidth, CompressDepth;
    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, 0);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    DAlign = pTexInfo->Alignment.DAlign;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Type == RESOURCE_3D)
    {
        ExpandedArraySize = GFX_ALIGN_NP2(ExpandedArraySize, DAlign) / CompressDepth;

        if(!pTexInfo->Flags.Info.Linear)
        {
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return BlockHeight;
}